

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

void xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt)

{
  int local_14;
  int i;
  xmlXIncludeCtxtPtr ctxt_local;
  
  if (ctxt != (xmlXIncludeCtxtPtr)0x0) {
    if (ctxt->urlTab != (xmlXIncludeDoc *)0x0) {
      for (local_14 = 0; local_14 < ctxt->urlNr; local_14 = local_14 + 1) {
        xmlFreeDoc(ctxt->urlTab[local_14].doc);
        (*xmlFree)(ctxt->urlTab[local_14].url);
      }
      (*xmlFree)(ctxt->urlTab);
    }
    for (local_14 = 0; local_14 < ctxt->incNr; local_14 = local_14 + 1) {
      if (ctxt->incTab[local_14] != (xmlXIncludeRefPtr)0x0) {
        xmlXIncludeFreeRef(ctxt->incTab[local_14]);
      }
    }
    if (ctxt->incTab != (xmlXIncludeRefPtr *)0x0) {
      (*xmlFree)(ctxt->incTab);
    }
    if (ctxt->txtTab != (xmlXIncludeTxt *)0x0) {
      for (local_14 = 0; local_14 < ctxt->txtNr; local_14 = local_14 + 1) {
        (*xmlFree)(ctxt->txtTab[local_14].text);
        (*xmlFree)(ctxt->txtTab[local_14].url);
      }
      (*xmlFree)(ctxt->txtTab);
    }
    if (ctxt->xpctxt != (xmlXPathContextPtr)0x0) {
      xmlXPathFreeContext(ctxt->xpctxt);
    }
    (*xmlFree)(ctxt);
  }
  return;
}

Assistant:

void
xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt) {
    int i;

    if (ctxt == NULL)
	return;
    if (ctxt->urlTab != NULL) {
	for (i = 0; i < ctxt->urlNr; i++) {
	    xmlFreeDoc(ctxt->urlTab[i].doc);
	    xmlFree(ctxt->urlTab[i].url);
	}
	xmlFree(ctxt->urlTab);
    }
    for (i = 0;i < ctxt->incNr;i++) {
	if (ctxt->incTab[i] != NULL)
	    xmlXIncludeFreeRef(ctxt->incTab[i]);
    }
    if (ctxt->incTab != NULL)
	xmlFree(ctxt->incTab);
    if (ctxt->txtTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    xmlFree(ctxt->txtTab[i].text);
	    xmlFree(ctxt->txtTab[i].url);
	}
	xmlFree(ctxt->txtTab);
    }
#ifdef LIBXML_XPTR_ENABLED
    if (ctxt->xpctxt != NULL)
	xmlXPathFreeContext(ctxt->xpctxt);
#endif
    xmlFree(ctxt);
}